

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_closeslot(lua_State *L,int idx)

{
  StkId pSVar1;
  
  if (idx < 1) {
    pSVar1 = (L->top).p + idx;
  }
  else {
    pSVar1 = (L->ci->func).p + (uint)idx;
  }
  pSVar1 = luaF_close(L,pSVar1,-1,0);
  (pSVar1->val).tt_ = '\0';
  return;
}

Assistant:

l_sinline StkId index2stack (lua_State *L, int idx) {
  CallInfo *ci = L->ci;
  if (idx > 0) {
    StkId o = ci->func.p + idx;
    api_check(L, o < L->top.p, "invalid index");
    return o;
  }
  else {    /* non-positive index */
    api_check(L, idx != 0 && -idx <= L->top.p - (ci->func.p + 1),
                 "invalid index");
    api_check(L, !ispseudo(idx), "invalid index");
    return L->top.p + idx;
  }
}